

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O0

int Io_ReadEqnStrFind(Vec_Ptr_t *vTokens,char *pName)

{
  int iVar1;
  char *__s1;
  int local_2c;
  int i;
  char *pToken;
  char *pName_local;
  Vec_Ptr_t *vTokens_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vTokens);
    if (iVar1 <= local_2c) {
      return -1;
    }
    __s1 = (char *)Vec_PtrEntry(vTokens,local_2c);
    iVar1 = strcmp(__s1,pName);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Io_ReadEqnStrFind( Vec_Ptr_t * vTokens, char * pName )
{
    char * pToken;
    int i;
    Vec_PtrForEachEntry( char *, vTokens, pToken, i )
        if ( strcmp( pToken, pName ) == 0 )
            return i;
    return -1;
}